

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

double trng::math::ln_binomial(double n,double m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = lgamma(n + 1.0);
  dVar2 = lgamma(m + 1.0);
  dVar3 = lgamma((n - m) + 1.0);
  return (dVar1 - dVar2) - dVar3;
}

Assistant:

TRNG_CUDA_ENABLE
    inline double ln_binomial(double n, double m) {
      return ln_Gamma(n + 1) - ln_Gamma(m + 1) - ln_Gamma(n - m + 1);
    }